

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exor.c
# Opt level: O0

void AddCubesToStartingCover(Vec_Wec_t *vEsop)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *pVars;
  int *pVarValues;
  Vec_Int_t *p;
  Cube *pC;
  int Out;
  int Lit;
  int k;
  int i;
  int c;
  int *s_LevelValues;
  int *s_Level2Var;
  Cube *pNew;
  Vec_Int_t *vCube;
  Vec_Wec_t *vEsop_local;
  
  pVars = (int *)malloc((long)g_CoverInfo.nVarsIn << 2);
  pVarValues = (int *)malloc((long)g_CoverInfo.nVarsIn << 2);
  for (Lit = 0; Lit < g_CoverInfo.nVarsIn; Lit = Lit + 1) {
    pVars[Lit] = Lit;
  }
  g_CoverInfo.nLiteralsBefore = 0;
  g_CoverInfo.QCostBefore = 0;
  for (k = 0; iVar2 = Vec_WecSize(vEsop), k < iVar2; k = k + 1) {
    p = Vec_WecEntry(vEsop,k);
    iVar2 = Vec_IntPop(p);
    for (Lit = 0; Lit < g_CoverInfo.nVarsIn; Lit = Lit + 1) {
      pVarValues[Lit] = 3;
    }
    for (Out = 0; iVar3 = Vec_IntSize(p), Out < iVar3; Out = Out + 1) {
      iVar3 = Vec_IntEntry(p,Out);
      iVar4 = Abc_LitIsCompl(iVar3);
      if (iVar4 == 0) {
        iVar3 = Abc_Lit2Var(iVar3);
        pVarValues[iVar3] = 2;
      }
      else {
        iVar3 = Abc_Lit2Var(iVar3);
        pVarValues[iVar3] = 1;
      }
    }
    pC = GetFreeCube();
    if (*pC->pCubeDataIn != 0) {
      for (Lit = 0; Lit < g_CoverInfo.nWordsIn; Lit = Lit + 1) {
        pC->pCubeDataIn[Lit] = 0;
      }
      for (Lit = 0; Lit < g_CoverInfo.nWordsOut; Lit = Lit + 1) {
        pC->pCubeDataOut[Lit] = 0;
      }
    }
    InsertVarsWithoutClearing(pC,pVars,g_CoverInfo.nVarsIn,pVarValues,-1 - iVar2);
    iVar2 = Vec_IntSize(p);
    pC->a = (short)iVar2;
    pC->z = 1;
    iVar2 = ComputeQCost(p);
    pC->q = (short)iVar2;
    bVar1 = (byte)g_CoverInfo.cIDs;
    g_CoverInfo.cIDs = g_CoverInfo.cIDs + 1;
    pC->ID = bVar1;
    if (g_CoverInfo.cIDs == 0x100) {
      g_CoverInfo.cIDs = 1;
    }
    CheckForCloseCubes(pC,1);
    iVar2 = Vec_IntSize(p);
    g_CoverInfo.nLiteralsBefore = iVar2 + g_CoverInfo.nLiteralsBefore;
    iVar2 = ComputeQCost(p);
    g_CoverInfo.QCostBefore = iVar2 + g_CoverInfo.QCostBefore;
  }
  if (pVars != (int *)0x0) {
    free(pVars);
  }
  if (pVarValues != (int *)0x0) {
    free(pVarValues);
  }
  if (g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc) {
    return;
  }
  __assert_fail("g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/exor/exor.c"
                ,0x2fd,"void AddCubesToStartingCover(Vec_Wec_t *)");
}

Assistant:

void AddCubesToStartingCover( Vec_Wec_t * vEsop )
{
    Vec_Int_t * vCube;
    Cube * pNew;
    int * s_Level2Var;
    int * s_LevelValues;
    int c, i, k, Lit, Out;

    s_Level2Var = ABC_ALLOC( int, g_CoverInfo.nVarsIn );
    s_LevelValues = ABC_ALLOC( int, g_CoverInfo.nVarsIn );

    for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
        s_Level2Var[i] = i;

    g_CoverInfo.nLiteralsBefore = 0;
    g_CoverInfo.QCostBefore = 0;
    Vec_WecForEachLevel( vEsop, vCube, c )
    {
        // get the output of this cube
        Out = -Vec_IntPop(vCube) - 1;

        // fill in the cube with blanks
        for ( i = 0; i < g_CoverInfo.nVarsIn; i++ )
            s_LevelValues[i] = VAR_ABS;
        Vec_IntForEachEntry( vCube, Lit, k )
        {
            if ( Abc_LitIsCompl(Lit) )
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_NEG;
            else
                s_LevelValues[Abc_Lit2Var(Lit)] = VAR_POS;
        }

        // get the new cube
        pNew = GetFreeCube();
        // consider the need to clear the cube
        if ( pNew->pCubeDataIn[0] ) // this is a recycled cube
        {
            for ( i = 0; i < g_CoverInfo.nWordsIn; i++ )
                pNew->pCubeDataIn[i] = 0;
            for ( i = 0; i < g_CoverInfo.nWordsOut; i++ )
                pNew->pCubeDataOut[i] = 0;
        }

        InsertVarsWithoutClearing( pNew, s_Level2Var, g_CoverInfo.nVarsIn, s_LevelValues, Out );
        // set literal counts
        pNew->a = Vec_IntSize(vCube);
        pNew->z = 1;
        pNew->q = ComputeQCost(vCube);
        // set the ID
        pNew->ID = g_CoverInfo.cIDs++;
        // skip through zero-ID
        if ( g_CoverInfo.cIDs == 256 )
            g_CoverInfo.cIDs = 1;

        // add this cube to storage
        CheckForCloseCubes( pNew, 1 );

        g_CoverInfo.nLiteralsBefore += Vec_IntSize(vCube);
        g_CoverInfo.QCostBefore += ComputeQCost(vCube);
    }
    ABC_FREE( s_Level2Var );
    ABC_FREE( s_LevelValues );

    assert ( g_CoverInfo.nCubesInUse + g_CoverInfo.nCubesFree == g_CoverInfo.nCubesAlloc );
}